

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O2

int __thiscall
JetHead::CircularBuffer::waitForData(CircularBuffer *this,int threshold,uint32_t msecs)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  timespec cur;
  timespec start;
  AutoLock lock;
  timespec local_68;
  timespec local_58;
  AutoLock local_48;
  
  TimeUtils::getCurTime(&local_58);
  AutoLock::AutoLock(&local_48,&this->mLock);
  uVar3 = msecs;
  do {
    uVar2 = this->mLen;
    if (threshold <= (int)uVar2) {
LAB_00116cca:
      uVar3 = 0;
      if (threshold <= (int)uVar2) {
        uVar3 = uVar2;
      }
      AutoLock::~AutoLock(&local_48);
      return uVar3;
    }
    bVar1 = Condition::Wait(&this->mDataCondition,&this->mLock,uVar3);
    if (!bVar1) {
      uVar2 = this->mLen;
      goto LAB_00116cca;
    }
    TimeUtils::getCurTime(&local_68);
    uVar3 = msecs - (((int)local_68.tv_sec - (int)local_58.tv_sec) * 1000 +
                    (int)((local_68.tv_nsec - local_58.tv_nsec) / 1000000));
  } while( true );
}

Assistant:

int CircularBuffer::waitForData( int threshold, uint32_t msecs )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	uint32_t timeout = msecs;	
	struct timespec start, cur;
	TimeUtils::getCurTime( &start );
	
	LOG_NOISE( "Waiting for data %d cur size %d timeout %d", threshold, length_internal(), msecs );

	AutoLock lock( mLock );
	
	if ( length_internal() < threshold )
		LOG_INFO( "buffer underflow" );
	
	while ( length_internal() < threshold && mDataCondition.Wait( mLock, timeout ) )
	{
		TimeUtils::getCurTime( &cur );
		timeout = msecs - TimeUtils::getDifference( &cur, &start );
		
		LOG_INFO( "Wating for data %d cur size %d msecs remaining %d", threshold, length_internal(), timeout );
	}

	if ( length_internal() >= threshold )
		return length_internal();
	else
		return 0;
}